

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_keywords.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBKeywordsInit(ClientContext *context,TableFunctionInitInput *input)

{
  pointer pDVar1;
  _Head_base<0UL,_duckdb::DuckDBKeywordsData_*,_false> local_30;
  vector<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_> local_28;
  
  make_uniq<duckdb::DuckDBKeywordsData>();
  Parser::KeywordList();
  pDVar1 = unique_ptr<duckdb::DuckDBKeywordsData,_std::default_delete<duckdb::DuckDBKeywordsData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBKeywordsData,_std::default_delete<duckdb::DuckDBKeywordsData>,_true>
                         *)&local_30);
  ::std::vector<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_>::_M_move_assign
            (&(pDVar1->entries).
              super_vector<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_>,&local_28)
  ;
  ::std::vector<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_>::~vector(&local_28);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBKeywordsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBKeywordsData>();
	result->entries = Parser::KeywordList();
	return std::move(result);
}